

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void __thiscall tcu::Matrix<tcu::Interval,_2,_2>::Matrix(Matrix<tcu::Interval,_2,_2> *this)

{
  bool *pbVar1;
  undefined8 *puVar2;
  double *pdVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  undefined4 local_e;
  undefined3 uStack_a;
  undefined4 local_7;
  undefined3 uStack_3;
  
  lVar5 = 0x20;
  do {
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar5 + -0x20) = 0;
    puVar2 = (undefined8 *)((long)((this->m_data).m_data[0].m_data + -1) + lVar5);
    *puVar2 = 0x7ff0000000000000;
    puVar2[1] = 0xfff0000000000000;
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar5 + -8) = 0;
    pbVar1 = &(this->m_data).m_data[0].m_data[0].m_hasNaN + lVar5;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0x80);
  lVar5 = 0;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    (this->m_data).m_data[lVar5].m_data[0].m_hasNaN = false;
    *(undefined4 *)&(this->m_data).m_data[lVar5].m_data[0].field_0x1 = local_7;
    *(uint *)&(this->m_data).m_data[lVar5].m_data[0].field_0x4 = CONCAT31(uStack_3,local_7._3_1_);
    pdVar3 = &(this->m_data).m_data[lVar5].m_data[0].m_lo;
    *pdVar3 = INFINITY;
    pdVar3[1] = -INFINITY;
    (this->m_data).m_data[lVar5].m_data[1].m_hasNaN = false;
    *(undefined4 *)&(this->m_data).m_data[lVar5].m_data[1].field_0x1 = local_e;
    *(uint *)&(this->m_data).m_data[lVar5].m_data[1].field_0x4 = CONCAT31(uStack_a,local_e._3_1_);
    pdVar3 = &(this->m_data).m_data[lVar5].m_data[1].m_lo;
    *pdVar3 = INFINITY;
    pdVar3[1] = -INFINITY;
    lVar5 = 1;
    bVar4 = false;
  } while (bVar6);
  lVar5 = 0;
  uVar7 = 0;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    uVar8 = 0x3ff00000;
    if (!bVar6) {
      uVar8 = 0;
    }
    (this->m_data).m_data[0].m_data[lVar5].m_hasNaN = false;
    (this->m_data).m_data[0].m_data[lVar5].m_lo = (double)((ulong)uVar8 << 0x20);
    (this->m_data).m_data[0].m_data[lVar5].m_hi = (double)((ulong)uVar8 << 0x20);
    (this->m_data).m_data[1].m_data[lVar5].m_hasNaN = false;
    (this->m_data).m_data[1].m_data[lVar5].m_lo = (double)((ulong)uVar7 << 0x20);
    (this->m_data).m_data[1].m_data[lVar5].m_hi = (double)((ulong)uVar7 << 0x20);
    lVar5 = 1;
    uVar7 = 0x3ff00000;
    bVar4 = false;
  } while (bVar6);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}